

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

int pdrv(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  stringstream msg;
  StatisticsApp application;
  CommandLineOptions options;
  
  CommandLineOptions::CommandLineOptions(&options);
  CommandLineParser::CommandLineParser((CommandLineParser *)&application,argc,argv);
  if (application._outputFile == (ofstream)0x1) {
    CommandLineParser::printUsage();
  }
  else {
    if (application._289_1_ != '\x01') {
      CommandLineOptions::operator=(&options,&application._options);
      CommandLineOptions::~CommandLineOptions(&application._options);
      StatisticsApp::StatisticsApp(&application,&options);
      iVar2 = StatisticsApp::run(&application);
      if (iVar2 == 0) {
        bVar1 = StatisticsApp::display(&application);
        iVar2 = (uint)!bVar1 + (uint)!bVar1 * 2;
      }
      else {
        iVar2 = 2;
      }
      StatisticsApp::~StatisticsApp(&application);
      goto LAB_0017d40b;
    }
    CommandLineParser::printVersion();
  }
  CommandLineOptions::~CommandLineOptions(&application._options);
  iVar2 = 0;
LAB_0017d40b:
  CommandLineOptions::~CommandLineOptions(&options);
  return iVar2;
}

Assistant:

int
pdrv(int argc,
     char * argv[])
{

    // ======================================================================
    // Parse command line arguments
    // ----------------------------------------------------------------------
    CommandLineOptions options;

    try
    {
        CommandLineParser parser(argc, argv);
        if (parser.showUsage())
        {
            CommandLineParser::printUsage();
            return AppStatus::SUCCESS;
        }
        else if (parser.showVersion())
        {
            CommandLineParser::printVersion();
            return AppStatus::SUCCESS;
        }
        options = parser.options;
    }
    catch (std::exception & ex)
    {
        LOG_MESSAGE(Logger::Level::FATAL, ex.what());
        return AppStatus::FAILED_PARSING;
    }

    // ======================================================================
    // Launch application
    // ----------------------------------------------------------------------
    StatisticsApp application(options);

    try
    {
        int status = application.run();
        if (status != 0) return AppStatus::FAILED_RUN;
    }
    catch (std::exception & ex)
    {
        LOG_MESSAGE(Logger::Level::FATAL, ex.what());
        return AppStatus::FAILED_RUN;
    }

    // ======================================================================
    // Display results
    // ----------------------------------------------------------------------
    
    try
    {
        bool isDisplayValid = application.display();
        if (!isDisplayValid) return AppStatus::FAILED_DISPLAY;
    }
    catch (std::exception & ex)
    {
        LOG_MESSAGE(Logger::Level::FATAL, ex.what());
        return AppStatus::FAILED_DISPLAY;
    }
        
    return AppStatus::SUCCESS;

}